

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

int32 revert_bkp(int32 mixw_reest,int32 tmat_reest,int32 mean_reest,int32 var_reest,char *out_dir)

{
  int in_EAX;
  int iVar1;
  int32 extraout_EAX;
  long ln;
  char fn [4097];
  char fn_bkp [4097];
  char acStack_2048 [4112];
  char local_1038 [4104];
  
  if (mixw_reest != 0) {
    sprintf(acStack_2048,"%s/mixw_counts",out_dir);
    sprintf(local_1038,"%s/mixw_counts.bkp",out_dir);
    in_EAX = rename(local_1038,acStack_2048);
    if (in_EAX < 0) {
      ln = 0x2dd;
      goto LAB_00104a05;
    }
  }
  if (tmat_reest != 0) {
    sprintf(acStack_2048,"%s/tmat_counts",out_dir);
    sprintf(local_1038,"%s/tmat_counts.bkp",out_dir);
    in_EAX = rename(local_1038,acStack_2048);
    if (in_EAX < 0) {
      ln = 0x2e7;
      goto LAB_00104a05;
    }
  }
  if (var_reest == 0 && mean_reest == 0) {
    return in_EAX;
  }
  sprintf(acStack_2048,"%s/gauden_counts",out_dir);
  sprintf(local_1038,"%s/gauden_counts.bkp",out_dir);
  iVar1 = rename(local_1038,acStack_2048);
  if (-1 < iVar1) {
    return iVar1;
  }
  ln = 0x2f0;
LAB_00104a05:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                 ,ln,"Couldn\'t revert to backup of %s\n",acStack_2048);
  return extraout_EAX;
}

Assistant:

static int32
revert_bkp(int32 mixw_reest,
	   int32 tmat_reest,
	   int32 mean_reest,
	   int32 var_reest,
	   const char *out_dir)
{
    char fn[MAXPATHLEN+1];
    char fn_bkp[MAXPATHLEN+1];

    if (mixw_reest) {
	sprintf(fn, "%s/mixw_counts", out_dir);
	sprintf(fn_bkp, "%s/mixw_counts.bkp", out_dir);

	if (rename(fn_bkp, fn) < 0) {
	    E_ERROR_SYSTEM("Couldn't revert to backup of %s\n", fn);
	    
	    return S3_ERROR;
	}
    }
    if (tmat_reest) {
	sprintf(fn, "%s/tmat_counts", out_dir);
	sprintf(fn_bkp, "%s/tmat_counts.bkp", out_dir);

	if (rename(fn_bkp, fn) < 0) {
	    E_ERROR_SYSTEM("Couldn't revert to backup of %s\n", fn);
	    return S3_ERROR;
	}
    }
    if (mean_reest || var_reest) {
	sprintf(fn, "%s/gauden_counts", out_dir);
	sprintf(fn_bkp, "%s/gauden_counts.bkp", out_dir);

	if (rename(fn_bkp, fn) < 0) {
	    E_ERROR_SYSTEM("Couldn't revert to backup of %s\n", fn);
	    return S3_ERROR;
	}
    }

    return S3_SUCCESS;
}